

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonToken.cpp
# Opt level: O0

string * __thiscall antlr::CommonToken::toString_abi_cxx11_(CommonToken *this)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  long *in_RSI;
  string *in_RDI;
  undefined4 in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb4;
  undefined4 in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffebc;
  string local_110 [32];
  string local_f0 [4];
  int in_stack_ffffffffffffff14;
  string *in_stack_ffffffffffffff18;
  string local_d0 [32];
  string local_b0 [32];
  string local_90 [32];
  string local_70 [32];
  string local_50 [32];
  string local_30 [48];
  
  (**(code **)(*in_RSI + 0x20))();
  std::operator+((char *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                 (char *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
  uVar1 = (**(code **)(*in_RSI + 0x30))();
  antlr::operator+(in_stack_ffffffffffffff18,in_stack_ffffffffffffff14);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(uVar1,in_stack_fffffffffffffeb8),
                 (char *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
  uVar2 = (**(code **)(*in_RSI + 0x18))();
  antlr::operator+(in_stack_ffffffffffffff18,in_stack_ffffffffffffff14);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(uVar1,uVar2),
                 (char *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
  uVar3 = (**(code **)(*in_RSI + 0x10))();
  antlr::operator+(in_stack_ffffffffffffff18,in_stack_ffffffffffffff14);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(uVar1,uVar2),(char *)CONCAT44(uVar3,in_stack_fffffffffffffeb0));
  std::__cxx11::string::~string(local_30);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string(local_90);
  std::__cxx11::string::~string(local_b0);
  std::__cxx11::string::~string(local_d0);
  std::__cxx11::string::~string(local_f0);
  std::__cxx11::string::~string(local_110);
  return in_RDI;
}

Assistant:

string CommonToken::toString() const
{
	return "[\""+getText()+"\",<"+getType()+">,line="+getLine()+",column="+getColumn()+"]";
}